

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O3

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getTransferMethodStr_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TransferMethod method,
          bool isDescription)

{
  char cVar1;
  ctype *pcVar2;
  string *psVar3;
  long lVar4;
  size_type ndx;
  ulong uVar5;
  char cVar6;
  char *pcVar7;
  locale loc;
  ostringstream desc;
  char local_1b9;
  string *local_1b8;
  locale local_1b0 [8];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::locale::locale(local_1b0);
  cVar6 = (char)method;
  switch((ulong)this & 0xffffffff) {
  case 0:
    lVar4 = 0;
    local_1b8 = __return_storage_ptr__;
    do {
      if (lVar4 == 4 && cVar6 == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      }
      else {
        cVar1 = "COPY_BUFFER"[lVar4];
        pcVar2 = std::use_facet<std::ctype<char>>(local_1b0);
        local_1b9 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)cVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0xb);
    break;
  case 1:
    lVar4 = 0;
    local_1b8 = __return_storage_ptr__;
    do {
      if (lVar4 == 4 && cVar6 == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      }
      else {
        cVar1 = "COPY_IMAGE"[lVar4];
        pcVar2 = std::use_facet<std::ctype<char>>(local_1b0);
        local_1b9 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)cVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 10);
    break;
  case 2:
    lVar4 = 0;
    local_1b8 = __return_storage_ptr__;
    do {
      if (lVar4 == 4 && cVar6 == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      }
      else {
        cVar1 = "BLIT_IMAGE"[lVar4];
        pcVar2 = std::use_facet<std::ctype<char>>(local_1b0);
        local_1b9 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)cVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 10);
    break;
  case 3:
    uVar5 = 0;
    pcVar7 = " ";
    local_1b8 = __return_storage_ptr__;
    do {
      while ((cVar6 == '\0' || ((0x4810UL >> (uVar5 & 0x3f) & 1) == 0))) {
        cVar1 = "COPY_BUFFER_TO_IMAGE"[uVar5];
        pcVar2 = std::use_facet<std::ctype<char>>(local_1b0);
        local_1b9 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)cVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
        uVar5 = uVar5 + 1;
        if (uVar5 == 0x14) goto LAB_00493e26;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x14);
    goto LAB_00493e2a;
  case 4:
    uVar5 = 0;
    pcVar7 = " ";
    local_1b8 = __return_storage_ptr__;
    do {
      while ((cVar6 != '\0' && ((0x2410UL >> (uVar5 & 0x3f) & 1) != 0))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
        uVar5 = uVar5 + 1;
        if (uVar5 == 0x14) goto LAB_00493e2a;
      }
      cVar1 = "COPY_IMAGE_TO_BUFFER"[uVar5];
      pcVar2 = std::use_facet<std::ctype<char>>(local_1b0);
      local_1b9 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)cVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x14);
    break;
  case 5:
    lVar4 = 0;
    local_1b8 = __return_storage_ptr__;
    do {
      if (lVar4 == 6 && cVar6 == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      }
      else {
        cVar1 = "UPDATE_BUFFER"[lVar4];
        pcVar2 = std::use_facet<std::ctype<char>>(local_1b0);
        local_1b9 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)cVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0xd);
    break;
  case 6:
    lVar4 = 0;
    local_1b8 = __return_storage_ptr__;
    do {
      if (lVar4 == 4 && cVar6 == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      }
      else {
        cVar1 = "FILL_BUFFER"[lVar4];
        pcVar2 = std::use_facet<std::ctype<char>>(local_1b0);
        local_1b9 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)cVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0xb);
    break;
  case 7:
    lVar4 = 0;
    local_1b8 = __return_storage_ptr__;
    do {
      for (; (cVar6 != '\0' && ((lVar4 == 0xb || (lVar4 == 5)))); lVar4 = lVar4 + 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      }
      cVar1 = "CLEAR_COLOR_IMAGE"[lVar4];
      pcVar2 = std::use_facet<std::ctype<char>>(local_1b0);
      local_1b9 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)cVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x11);
    break;
  case 8:
    uVar5 = 0;
    pcVar7 = " ";
    local_1b8 = __return_storage_ptr__;
    do {
      while ((cVar6 != '\0' && ((0x80820UL >> (uVar5 & 0x3f) & 1) != 0))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
        uVar5 = uVar5 + 1;
        if (uVar5 == 0x19) goto LAB_00493e2a;
      }
      cVar1 = "CLEAR_DEPTH_STENCIL_IMAGE"[uVar5];
      pcVar2 = std::use_facet<std::ctype<char>>(local_1b0);
      local_1b9 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)cVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x19);
    break;
  case 9:
    lVar4 = 0;
    local_1b8 = __return_storage_ptr__;
    do {
      if (lVar4 == 7 && cVar6 == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      }
      else {
        cVar1 = "RESOLVE_IMAGE"[lVar4];
        pcVar2 = std::use_facet<std::ctype<char>>(local_1b0);
        local_1b9 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)cVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0xd);
    break;
  case 10:
    uVar5 = 0;
    pcVar7 = " ";
    local_1b8 = __return_storage_ptr__;
    do {
      while ((cVar6 != '\0' && ((0x8410UL >> (uVar5 & 0x3f) & 1) != 0))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
        uVar5 = uVar5 + 1;
        if (uVar5 == 0x17) goto LAB_00493e2a;
      }
      cVar1 = "COPY_QUERY_POOL_RESULTS"[uVar5];
      pcVar2 = std::use_facet<std::ctype<char>>(local_1b0);
      local_1b9 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)cVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x17);
    break;
  default:
    lVar4 = 0xf;
    pcVar7 = "unknown method!";
    goto LAB_00493e4d;
  }
LAB_00493e26:
  pcVar7 = "_";
  if (cVar6 != '\0') {
    pcVar7 = " ";
  }
LAB_00493e2a:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,1);
  lVar4 = 6;
  pcVar7 = "method";
LAB_00493e4d:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,lVar4);
  std::__cxx11::stringbuf::str();
  std::locale::~locale(local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  psVar3 = (string *)std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string getTransferMethodStr(const TransferMethod method,
								 bool                 isDescription)
{
	std::ostringstream desc;
	std::locale loc;
	switch(method)
	{
#define METHOD_CASE(p)                             \
		case TRANSFER_METHOD_##p:                  \
		{                                          \
			GEN_DESC_STRING(p, method);            \
			break;                                 \
		}
	  METHOD_CASE(COPY_BUFFER)
	  METHOD_CASE(COPY_IMAGE)
	  METHOD_CASE(BLIT_IMAGE)
	  METHOD_CASE(COPY_BUFFER_TO_IMAGE)
	  METHOD_CASE(COPY_IMAGE_TO_BUFFER)
	  METHOD_CASE(UPDATE_BUFFER)
	  METHOD_CASE(FILL_BUFFER)
	  METHOD_CASE(CLEAR_COLOR_IMAGE)
	  METHOD_CASE(CLEAR_DEPTH_STENCIL_IMAGE)
	  METHOD_CASE(RESOLVE_IMAGE)
	  METHOD_CASE(COPY_QUERY_POOL_RESULTS)
#undef METHOD_CASE
	  default:
		desc << "unknown method!";
		DE_FATAL("Unknown method!");
		break;
	};

	return desc.str();
}